

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O2

void msd_lsd<12u>(Cacheblock<12U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  void *__src;
  long lVar7;
  Cacheblock<12U> *pCVar8;
  size_t i;
  long lVar9;
  Cacheblock<12U> *pCVar10;
  uchar *puVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  long local_1038 [256];
  long local_838 [257];
  
LAB_0019df9d:
  pCVar8 = cache;
  if (0x1f < N) {
    fill_cache<12u>(cache,N,depth);
    for (uVar13 = 0xb; -1 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
      puVar11 = (cache->chars)._M_elems + uVar13;
      memset(local_1038 + 0x100,0,0x800);
      uVar6 = N;
      while (bVar15 = uVar6 != 0, uVar6 = uVar6 - 1, bVar15) {
        local_1038[(ulong)*puVar11 + 0x100] = local_1038[(ulong)*puVar11 + 0x100] + 1;
        puVar11 = puVar11 + 0x18;
      }
      __src = malloc(N * 0x18);
      local_1038[0] = 0;
      lVar7 = 0;
      for (lVar9 = 1; pCVar8 = cache, uVar6 = N, lVar9 != 0x100; lVar9 = lVar9 + 1) {
        lVar7 = lVar7 + local_1038[lVar9 + 0xff];
        local_1038[lVar9] = lVar7;
      }
      while (uVar6 != 0) {
        bVar2 = (pCVar8->chars)._M_elems[uVar13];
        lVar9 = local_1038[bVar2];
        local_1038[bVar2] = lVar9 + 1;
        lVar9 = lVar9 * 0x18;
        *(uchar **)((long)__src + lVar9 + 0x10) = pCVar8->ptr;
        uVar4 = *(undefined8 *)((pCVar8->chars)._M_elems + 8);
        puVar1 = (undefined8 *)((long)__src + lVar9);
        *puVar1 = *(undefined8 *)(pCVar8->chars)._M_elems;
        puVar1[1] = uVar4;
        pCVar8 = pCVar8 + 1;
        uVar6 = uVar6 - 1;
      }
      memcpy(cache,__src,N * 0x18);
      free(__src);
    }
    depth = depth + 0xc;
    lVar9 = 0;
    do {
      lVar14 = lVar9;
      lVar7 = -1;
      pCVar8 = cache + lVar14;
      while( true ) {
        if (lVar14 - N == lVar7) {
          N = -lVar7;
          if (N == 0 || lVar7 == -1) {
            return;
          }
          pCVar8 = cache + lVar14;
          cache = cache + lVar14;
          if ((pCVar8->chars)._M_elems[0xb] == '\0') {
            return;
          }
          goto LAB_0019df9d;
        }
        iVar5 = bcmp(pCVar8,pCVar8 + 1,0xc);
        if (iVar5 != 0) break;
        lVar7 = lVar7 + -1;
        pCVar8 = pCVar8 + 1;
      }
      lVar9 = lVar14 - lVar7;
      if ((1 < (ulong)-lVar7) && (cache[lVar14].chars._M_elems[0xb] != '\0')) {
        msd_lsd<12u>(cache + lVar14,-lVar7,depth);
      }
    } while( true );
  }
  do {
    if ((int)N < 2) {
      return;
    }
    N = (size_t)((int)N - 1);
    puVar11 = pCVar8[1].ptr;
    for (pCVar10 = pCVar8 + 1; cache < pCVar10; pCVar10 = pCVar10 + -1) {
      sVar12 = depth;
      while( true ) {
        bVar2 = pCVar10[-1].ptr[sVar12];
        bVar3 = puVar11[sVar12];
        if ((bVar2 == 0) || (bVar2 != bVar3)) break;
        sVar12 = sVar12 + 1;
      }
      if (bVar2 <= bVar3) break;
      pCVar10->ptr = pCVar10[-1].ptr;
    }
    pCVar10->ptr = puVar11;
    pCVar8 = pCVar8 + 1;
  } while( true );
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}